

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDynamicLibrary.c
# Opt level: O0

deFunctionPtr deDynamicLibrary_getFunction(deDynamicLibrary *library,char *symbolName)

{
  deFunctionPtr p_Var1;
  anon_union_8_2_9e4fb06c ptr;
  char *symbolName_local;
  deDynamicLibrary *library_local;
  
  p_Var1 = (deFunctionPtr)dlsym(library->libHandle,symbolName);
  return p_Var1;
}

Assistant:

deFunctionPtr deDynamicLibrary_getFunction (const deDynamicLibrary* library, const char* symbolName)
{
	/* C forbids direct cast from object pointer to function pointer */
	union
	{
		deFunctionPtr	funcPtr;
		void*			objPtr;
	} ptr;

	DE_ASSERT(library && library->libHandle && symbolName);
	ptr.objPtr = dlsym(library->libHandle, symbolName);
	return ptr.funcPtr;
}